

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexerFacts.cpp
# Opt level: O1

SyntaxKind __thiscall
slang::parsing::LexerFacts::getDirectiveKind
          (LexerFacts *this,string_view directive,bool enableLegacyProtect)

{
  long lVar1;
  char *pcVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  size_t __n;
  char *__s1;
  int iVar10;
  SyntaxKind SVar11;
  uint64_t uVar12;
  uint uVar13;
  long *plVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  long *plVar18;
  ulong *puVar19;
  undefined1 *this_00;
  long lVar20;
  bool bVar21;
  undefined1 auVar22 [16];
  value_type *elements;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  local_40._M_str = (char *)directive._M_len;
  this_00 = directiveTable;
  bVar21 = (int)directive._M_str != 0;
  if (bVar21) {
    this_00 = &directivesWithLegacyProtect;
  }
  plVar14 = (long *)(directiveTable + 0x10);
  if (bVar21) {
    plVar14 = &DAT_0030adb0;
  }
  plVar18 = (long *)(directiveTable + 0x18);
  if (bVar21) {
    plVar18 = &DAT_0030adb8;
  }
  puVar19 = (ulong *)(directiveTable + 8);
  if (bVar21) {
    puVar19 = &DAT_0030ada8;
  }
  local_40._M_len = (size_t)this;
  uVar12 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                     ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)this_00,
                      &local_40);
  __s1 = local_40._M_str;
  __n = local_40._M_len;
  uVar15 = uVar12 >> (*this_00 & 0x3f);
  lVar3 = *plVar14;
  lVar1 = (uVar12 & 0xff) * 4;
  cVar6 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          match_word(unsigned_long)::word[lVar1 + 0xc];
  cVar7 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          match_word(unsigned_long)::word[lVar1 + 0xd];
  cVar8 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          match_word(unsigned_long)::word[lVar1 + 0xe];
  cVar9 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          match_word(unsigned_long)::word[lVar1 + 0xf];
  lVar1 = *plVar18;
  uVar4 = *puVar19;
  uVar17 = 0;
  do {
    pcVar2 = (char *)(lVar3 + uVar15 * 0x10);
    auVar22[0] = -(*pcVar2 == cVar6);
    auVar22[1] = -(pcVar2[1] == cVar7);
    auVar22[2] = -(pcVar2[2] == cVar8);
    auVar22[3] = -(pcVar2[3] == cVar9);
    auVar22[4] = -(pcVar2[4] == cVar6);
    auVar22[5] = -(pcVar2[5] == cVar7);
    auVar22[6] = -(pcVar2[6] == cVar8);
    auVar22[7] = -(pcVar2[7] == cVar9);
    auVar22[8] = -(pcVar2[8] == cVar6);
    auVar22[9] = -(pcVar2[9] == cVar7);
    auVar22[10] = -(pcVar2[10] == cVar8);
    auVar22[0xb] = -(pcVar2[0xb] == cVar9);
    auVar22[0xc] = -(pcVar2[0xc] == cVar6);
    auVar22[0xd] = -(pcVar2[0xd] == cVar7);
    auVar22[0xe] = -(pcVar2[0xe] == cVar8);
    auVar22[0xf] = -(pcVar2[0xf] == cVar9);
    uVar13 = (uint)(ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe);
    if (uVar13 != 0) {
      lVar16 = lVar1 + uVar15 * 0x168;
      do {
        uVar5 = 0;
        if (uVar13 != 0) {
          for (; (uVar13 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
          }
        }
        bVar21 = (LexerFacts *)__n == *(LexerFacts **)(lVar16 + (ulong)uVar5 * 0x18);
        lVar20 = lVar16 + (ulong)uVar5 * 0x18;
        if (bVar21 && (LexerFacts *)__n != (LexerFacts *)0x0) {
          iVar10 = bcmp(__s1,*(void **)(lVar20 + 8),__n);
          bVar21 = iVar10 == 0;
        }
        if (bVar21) goto LAB_0012634b;
        uVar13 = uVar13 - 1 & uVar13;
      } while (uVar13 != 0);
    }
    if ((*(byte *)(uVar15 * 0x10 + lVar3 + 0xf) &
        *(byte *)((long)&boost::unordered::detail::foa::
                         group15<boost::unordered::detail::foa::plain_integral>::
                         is_not_overflowed(unsigned_long)::shift + (ulong)((uint)uVar12 & 7))) == 0)
    break;
    lVar16 = uVar15 + uVar17;
    uVar17 = uVar17 + 1;
    uVar15 = lVar16 + 1U & uVar4;
  } while (uVar17 <= uVar4);
  lVar20 = 0;
LAB_0012634b:
  if (lVar20 == 0) {
    SVar11 = MacroUsage;
  }
  else {
    SVar11 = *(SyntaxKind *)(lVar20 + 0x10);
  }
  return SVar11;
}

Assistant:

SyntaxKind LexerFacts::getDirectiveKind(std::string_view directive, bool enableLegacyProtect) {
    auto& table = enableLegacyProtect ? directivesWithLegacyProtect : directiveTable;
    if (auto it = table.find(directive); it != table.end())
        return it->second;
    return SyntaxKind::MacroUsage;
}